

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSop.c
# Opt level: O2

void Abc_SopComplement(char *pSop)

{
  char cVar1;
  
  do {
    if (*pSop == '\n') {
      cVar1 = pSop[-1];
      if (cVar1 == '0') {
        cVar1 = '1';
      }
      else if (cVar1 == 'x') {
        cVar1 = 'n';
      }
      else if (cVar1 == 'n') {
        cVar1 = 'x';
      }
      else {
        if (cVar1 != '1') {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcSop.c"
                        ,0x267,"void Abc_SopComplement(char *)");
        }
        cVar1 = '0';
      }
      pSop[-1] = cVar1;
    }
    else if (*pSop == '\0') {
      return;
    }
    pSop = pSop + 1;
  } while( true );
}

Assistant:

void Abc_SopComplement( char * pSop )
{
    char * pCur;
    for ( pCur = pSop; *pCur; pCur++ )
        if ( *pCur == '\n' )
        {
            if ( *(pCur - 1) == '0' )
                *(pCur - 1) = '1';
            else if ( *(pCur - 1) == '1' )
                *(pCur - 1) = '0';
            else if ( *(pCur - 1) == 'x' )
                *(pCur - 1) = 'n';
            else if ( *(pCur - 1) == 'n' )
                *(pCur - 1) = 'x';
            else
                assert( 0 );
        }
}